

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::getp_append_all(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  vm_val_t *this_00;
  vm_val_t ele;
  
  if (getp_append_all(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar5 = __cxa_guard_acquire(&getp_append_all(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar5 != 0) {
      getp_append_all::desc.min_argc_ = 1;
      getp_append_all::desc.opt_argc_ = 0;
      getp_append_all::desc.varargs_ = 0;
      __cxa_guard_release(&getp_append_all(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&getp_append_all::desc);
  if (iVar5 == 0) {
    this_00 = sp_ + -1;
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    pvVar4 = sp_;
    uVar3 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar4->typ = retval->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    uVar6 = vm_val_t::ll_length(this_00);
    expand_by(this,self,(long)(int)uVar6);
    uVar8 = 0;
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    lVar7 = (ulong)uVar1 << 0x20;
    while (uVar6 != uVar8) {
      uVar8 = uVar8 + 1;
      vm_val_t::ll_index(this_00,&ele,(int)uVar8);
      set_element(this,lVar7 >> 0x20,&ele);
      lVar7 = lVar7 + 0x100000000;
    }
    sp_ = sp_ + -2;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_append_all(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                  uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the value to append, but leave it on the stack */
    vm_val_t *valp = G_stk->get(0);

    /* the result object is 'self' */
    retval->set_obj(self);

    /* push a self-reference for gc protection */
    G_stk->push(retval);

    /* get the old size */
    int cnt = get_element_count();

    /* get the number of items to add */
    int add_cnt = valp->ll_length(vmg0_);

    /* expand myself to make room for the new elements */
    expand_by(vmg_ self, add_cnt);

    /* add the new elements */
    for (int i = 1 ; i <= add_cnt ; ++i)
    {
        /* get the next new element */
        vm_val_t ele;
        valp->ll_index(vmg_ &ele, i);
        
        /* 
         *   add the new element - note that we don't need to keep undo
         *   because we created this new element in this same operation, and
         *   hence undoing the operation will truncate the vector to exclude
         *   the element, and hence we don't need an old value for the
         *   element 
         */
        set_element(cnt + i - 1, &ele);
    }

    /* discard the argument and gc protection */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}